

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineRenderingCreateInfoKHR *create_info,ScratchAllocator *alloc,
          VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  void *__src;
  undefined8 uVar1;
  undefined8 uVar2;
  VkFormat *pVVar3;
  undefined8 *puVar4;
  void *pvVar5;
  size_t size;
  
  puVar4 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x28,0x10);
  if (puVar4 != (undefined8 *)0x0) {
    uVar1 = *(undefined8 *)create_info;
    pvVar5 = create_info->pNext;
    uVar2 = *(undefined8 *)&create_info->viewMask;
    pVVar3 = create_info->pColorAttachmentFormats;
    puVar4[4] = *(undefined8 *)&create_info->depthAttachmentFormat;
    puVar4[2] = uVar2;
    puVar4[3] = pVVar3;
    *puVar4 = uVar1;
    puVar4[1] = pvVar5;
  }
  if ((state_flags & 8) == 0) {
    *(undefined8 *)((long)puVar4 + 0x14) = 0;
    *(undefined8 *)((long)puVar4 + 0x1c) = 0;
    *(undefined4 *)((long)puVar4 + 0x24) = 0;
    if ((state_flags & 6) == 0) {
      *(undefined4 *)(puVar4 + 2) = 0;
    }
  }
  else {
    if ((ulong)*(uint *)((long)puVar4 + 0x14) == 0) {
      pvVar5 = (void *)0x0;
    }
    else {
      __src = (void *)puVar4[3];
      size = (ulong)*(uint *)((long)puVar4 + 0x14) << 2;
      pvVar5 = ScratchAllocator::allocate_raw(alloc,size,0x10);
      if (pvVar5 != (void *)0x0) {
        memmove(pvVar5,__src,size);
      }
    }
    puVar4[3] = pvVar5;
  }
  return puVar4;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkPipelineRenderingCreateInfoKHR *create_info,
                                             ScratchAllocator &alloc,
                                             VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	auto *rendering = copy(create_info, 1, alloc);

	bool view_mask_sensitive = (state_flags & (VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT |
	                                           VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_SHADER_BIT_EXT |
	                                           VK_GRAPHICS_PIPELINE_LIBRARY_PRE_RASTERIZATION_SHADERS_BIT_EXT)) != 0;
	bool format_sensitive = (state_flags & VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT) != 0;

	if (format_sensitive)
	{
		rendering->pColorAttachmentFormats =
				copy(rendering->pColorAttachmentFormats, rendering->colorAttachmentCount, alloc);
	}
	else
	{
		rendering->colorAttachmentCount = 0;
		rendering->pColorAttachmentFormats = nullptr;
		rendering->depthAttachmentFormat = VK_FORMAT_UNDEFINED;
		rendering->stencilAttachmentFormat = VK_FORMAT_UNDEFINED;
		if (!view_mask_sensitive)
			rendering->viewMask = 0;
	}

	return rendering;
}